

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O0

void __thiscall gutil::Exception::print(Exception *this)

{
  ostream *this_00;
  long in_RDI;
  
  this_00 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 8));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Exception::print() const
{
  std::cerr << s << std::endl;

#if defined(DEBUG) && defined(__GNUC__)
  size_t s0=0;

  while (s0 != std::string::npos)
  {
    if (bt[s0] == '\n')
    {
      s0++;
    }

    size_t e0=bt.find_first_of(" \t(", s0);
    size_t s1=bt.find_first_of("[", e0);
    size_t e1=bt.find_first_of("]", s1);

    if (e0 != std::string::npos && s1 != std::string::npos &&
        e1 != std::string::npos)
    {
      std::string cmd="addr2line -e "+bt.substr(s0, e0-s0)+" "+
                      bt.substr(s1+1, e1-s1-1);

      if (system(cmd.c_str()) == -1)
      {
        std::cerr << cmd << " failed!" << std::endl;
      }
    }

    s0=bt.find_first_of("\n", e1);
  }

#endif
}